

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O0

void __thiscall Fl_Image::draw_empty(Fl_Image *this,int X,int Y)

{
  int iVar1;
  int iVar2;
  int Y_local;
  int X_local;
  Fl_Image *this_local;
  
  iVar1 = w(this);
  if (0 < iVar1) {
    iVar1 = h(this);
    if (0 < iVar1) {
      fl_color(0);
      iVar1 = w(this);
      iVar2 = h(this);
      fl_rect(X,Y,iVar1,iVar2);
      iVar1 = w(this);
      iVar2 = h(this);
      fl_line(X,Y,X + iVar1 + -1,Y + iVar2 + -1);
      iVar1 = h(this);
      iVar2 = w(this);
      fl_line(X,Y + iVar1 + -1,X + iVar2 + -1,Y);
    }
  }
  return;
}

Assistant:

void Fl_Image::draw_empty(int X, int Y) {
  if (w() > 0 && h() > 0) {
    fl_color(FL_FOREGROUND_COLOR);
    fl_rect(X, Y, w(), h());
    fl_line(X, Y, X + w() - 1, Y + h() - 1);
    fl_line(X, Y + h() - 1, X + w() - 1, Y);
  }
}